

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  istream *piVar1;
  double __x;
  Experiment experiment;
  Short step;
  Short k;
  string s;
  ofstream out;
  
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  piVar1 = std::istream::_M_extract<unsigned_short>((ushort *)&std::cin);
  piVar1 = std::istream::_M_extract<unsigned_short>((ushort *)piVar1);
  std::operator>>(piVar1,(string *)&s);
  std::ofstream::ofstream(&out,(string *)&s,_S_out);
  Experiment::Experiment(&experiment);
  Experiment::exp(&experiment,__x);
  Experiment::~Experiment(&experiment);
  std::ofstream::~ofstream(&out);
  std::__cxx11::string::~string((string *)&s);
  return 0;
}

Assistant:

int main()
{
    Num::Short k;
    Num::Short step;
    std::string s;

    std::cin>>k>>step>>s;
    std::ofstream out(s);

    Experiment experiment;
    experiment.exp(k,step, out);
}